

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMNormalizer::namespaceFixUp(DOMNormalizer *this,DOMElementImpl *ele)

{
  DOMAttrMapImpl *pDVar1;
  InScopeNamespaces *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMNode *node;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  XMLCh *pXVar8;
  undefined4 extraout_var_08;
  XMLCh *newPrefix;
  XMLCh *prefix_2;
  XMLCh *uri_2;
  DOMAttr *at_1;
  XMLSize_t j;
  XMLCh *uri;
  XMLCh *prefix;
  XMLCh *prefix_1;
  XMLCh *value;
  XMLCh *uri_1;
  DOMAttr *at;
  XMLSize_t i;
  XMLSize_t len;
  DOMAttrMapImpl *attrMap;
  DOMElementImpl *ele_local;
  DOMNormalizer *this_local;
  long *plVar5;
  undefined4 extraout_var_05;
  
  pDVar1 = ele->fAttributes;
  iVar3 = (*(pDVar1->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])();
  for (at = (DOMAttr *)0x0; at < (DOMAttr *)CONCAT44(extraout_var,iVar3);
      at = (DOMAttr *)((long)&(at->super_DOMNode)._vptr_DOMNode + 1)) {
    iVar4 = (*(pDVar1->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[3])(pDVar1,at);
    plVar5 = (long *)CONCAT44(extraout_var_00,iVar4);
    (**(code **)(*plVar5 + 0xa0))();
    pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xb0))();
    pXVar7 = (XMLCh *)(**(code **)(*plVar5 + 0x18))();
    bVar2 = XMLString::equals((XMLCh *)XMLUni::fgXMLNSURIName,pXVar6);
    if (bVar2) {
      bVar2 = XMLString::equals((XMLCh *)XMLUni::fgXMLNSURIName,pXVar7);
      if (bVar2) {
        error(this,NSDeclInvalid,(DOMNode *)ele);
      }
      else {
        pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xb8))();
        bVar2 = XMLString::equals(pXVar6,(XMLCh *)XMLUni::fgXMLNSString);
        if (bVar2) {
          this_00 = this->fNSScope;
          pXVar6 = (XMLCh *)(**(code **)(*plVar5 + 0xc0))();
          InScopeNamespaces::addOrChangeBinding(this_00,pXVar6,pXVar7,this->fMemoryManager);
        }
        else {
          InScopeNamespaces::addOrChangeBinding(this->fNSScope,L"",pXVar7,this->fMemoryManager);
        }
      }
    }
  }
  iVar3 = (*(ele->super_DOMElement).super_DOMNode._vptr_DOMNode[0x17])();
  uri = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
  if (uri == (XMLCh *)0x0) {
    uri = L"";
  }
  iVar3 = (*(ele->super_DOMElement).super_DOMNode._vptr_DOMNode[0x16])();
  j = CONCAT44(extraout_var_02,iVar3);
  if (j == 0) {
    j = (XMLSize_t)&XMLUni::fgZeroLenString;
  }
  bVar2 = XMLString::equals((XMLCh *)j,L"");
  if (bVar2) {
    iVar3 = (*(ele->super_DOMElement).super_DOMNode._vptr_DOMNode[0x18])();
    if (CONCAT44(extraout_var_03,iVar3) == 0) {
      error(this,DOMLevel1Node,(DOMNode *)ele);
    }
    else {
      bVar2 = InScopeNamespaces::isValidBinding(this->fNSScope,L"",L"");
      if (!bVar2) {
        addOrChangeNamespaceDecl(this,L"",L"",ele);
        InScopeNamespaces::addOrChangeBinding(this->fNSScope,L"",L"",this->fMemoryManager);
      }
    }
  }
  else {
    bVar2 = InScopeNamespaces::isValidBinding(this->fNSScope,uri,(XMLCh *)j);
    if (!bVar2) {
      addOrChangeNamespaceDecl(this,uri,(XMLCh *)j,ele);
      InScopeNamespaces::addOrChangeBinding(this->fNSScope,uri,(XMLCh *)j,this->fMemoryManager);
    }
  }
  iVar3 = (*(pDVar1->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])();
  for (at_1 = (DOMAttr *)0x0; at_1 < (DOMAttr *)CONCAT44(extraout_var_04,iVar3);
      at_1 = (DOMAttr *)((long)&(at_1->super_DOMNode)._vptr_DOMNode + 1)) {
    iVar4 = (*(pDVar1->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[3])(pDVar1,at_1);
    node = (DOMNode *)CONCAT44(extraout_var_05,iVar4);
    iVar4 = (*node->_vptr_DOMNode[0x16])();
    pXVar6 = (XMLCh *)CONCAT44(extraout_var_06,iVar4);
    iVar4 = (*node->_vptr_DOMNode[0x17])();
    pXVar7 = (XMLCh *)CONCAT44(extraout_var_07,iVar4);
    bVar2 = XMLString::equals((XMLCh *)XMLUni::fgXMLNSURIName,pXVar6);
    if (!bVar2) {
      if (pXVar6 == (XMLCh *)0x0) {
        iVar4 = (*node->_vptr_DOMNode[0x18])();
        if (CONCAT44(extraout_var_08,iVar4) == 0) {
          error(this,DOMLevel1Node,node);
        }
      }
      else if ((pXVar7 == (XMLCh *)0x0) ||
              (bVar2 = InScopeNamespaces::isValidBinding(this->fNSScope,pXVar7,pXVar6), !bVar2)) {
        pXVar8 = InScopeNamespaces::getPrefix(this->fNSScope,pXVar6);
        if (pXVar8 == (XMLCh *)0x0) {
          if ((pXVar7 == (XMLCh *)0x0) ||
             (pXVar8 = InScopeNamespaces::getUri(this->fNSScope,pXVar7), pXVar8 != (XMLCh *)0x0)) {
            pXVar7 = addCustomNamespaceDecl(this,pXVar6,ele);
            InScopeNamespaces::addOrChangeBinding(this->fNSScope,pXVar7,pXVar6,this->fMemoryManager)
            ;
            (*node->_vptr_DOMNode[0x19])(node,pXVar7);
          }
          else {
            InScopeNamespaces::addOrChangeBinding(this->fNSScope,pXVar7,pXVar6,this->fMemoryManager)
            ;
            addOrChangeNamespaceDecl(this,pXVar7,pXVar6,ele);
          }
        }
        else {
          (*node->_vptr_DOMNode[0x19])(node,pXVar8);
        }
      }
    }
  }
  return;
}

Assistant:

void DOMNormalizer::namespaceFixUp(DOMElementImpl *ele) const {
    DOMAttrMapImpl *attrMap = ele->fAttributes;

    XMLSize_t len = attrMap->getLength();
    //get the ns info from the attrs
    for(XMLSize_t i = 0; i < len; i++) {
        DOMAttr *at = (DOMAttr*)attrMap->item(i);

        //normalize the attr whatever happens
        at->normalize();

        const XMLCh *uri = at->getNamespaceURI();
        const XMLCh *value = at->getNodeValue();

        if(XMLString::equals(XMLUni::fgXMLNSURIName, uri)) {
            if(XMLString::equals(XMLUni::fgXMLNSURIName, value)) {
                error(XMLErrs::NSDeclInvalid, ele);
            }
            else {
                const XMLCh *prefix = at->getPrefix();

                if(XMLString::equals(prefix, XMLUni::fgXMLNSString)) {
                    fNSScope->addOrChangeBinding(at->getLocalName(), value, fMemoryManager);
                }
                else {
                    fNSScope->addOrChangeBinding(XMLUni::fgZeroLenString, value, fMemoryManager);
                }
            }
        }
    }

    const XMLCh* prefix = ele->getPrefix();
    prefix ? prefix : prefix = XMLUni::fgZeroLenString;
    const XMLCh* uri = ele->getNamespaceURI();
    uri ? uri : uri = XMLUni::fgZeroLenString;

    if(!XMLString::equals(uri, XMLUni::fgZeroLenString)) {
        if(!fNSScope->isValidBinding(prefix, uri)) {
            addOrChangeNamespaceDecl(prefix, uri, ele);
            fNSScope->addOrChangeBinding(prefix, uri, fMemoryManager);
        }
    }
    else {
        if(ele->getLocalName() == 0) {
            error(XMLErrs::DOMLevel1Node, ele);
        }
        else if(!fNSScope->isValidBinding(XMLUni::fgZeroLenString, XMLUni::fgZeroLenString)) {
            addOrChangeNamespaceDecl(XMLUni::fgZeroLenString, XMLUni::fgZeroLenString, ele);
            fNSScope->addOrChangeBinding(XMLUni::fgZeroLenString, XMLUni::fgZeroLenString, fMemoryManager);
        }
    }

    //fix up non ns attrs
    len = attrMap->getLength();

    // hp aCC complains this i is a redefinition of the i on line 283
    for(XMLSize_t j = 0; j < len; j++) {
        DOMAttr *at = (DOMAttr*)attrMap->item(j);
        const XMLCh *uri = at->getNamespaceURI();
        const XMLCh* prefix = at->getPrefix();

        if(!XMLString::equals(XMLUni::fgXMLNSURIName, uri)) {
            if(uri != 0) {
                if(prefix == 0 || !fNSScope->isValidBinding(prefix, uri)) {

                    const XMLCh* newPrefix =  fNSScope->getPrefix(uri);

                    if(newPrefix != 0) {
                        at->setPrefix(newPrefix);
                    }
                    else {
                        if(prefix != 0 && !fNSScope->getUri(prefix)) {
                            fNSScope->addOrChangeBinding(prefix, uri, fMemoryManager);
                            addOrChangeNamespaceDecl(prefix, uri, ele);
                        }
                        else {
                            newPrefix = addCustomNamespaceDecl(uri, ele);
                            fNSScope->addOrChangeBinding(newPrefix, uri, fMemoryManager);
                            at->setPrefix(newPrefix);
                        }
                    }
                }
            }
            else if(at->getLocalName() == 0) {
                error(XMLErrs::DOMLevel1Node, at);
            }
        }
    }
}